

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O1

void jinit_d_main_controller(j_decompress_ptr cinfo,boolean need_full_buffer)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_d_main_controller *pjVar3;
  jpeg_d_main_controller *pjVar4;
  _func_void_j_decompress_ptr_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION *p_Var5;
  void *pvVar6;
  JSAMPARRAY ppJVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  
  pjVar4 = (jpeg_d_main_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x88);
  cinfo->main = pjVar4;
  pjVar4->start_pass = start_pass_main;
  if (need_full_buffer != 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 4;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  iVar8 = cinfo->min_DCT_scaled_size;
  if (cinfo->upsample->need_context_rows != 0) {
    if (iVar8 < 2) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x2f;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    pjVar3 = cinfo->main;
    iVar8 = cinfo->min_DCT_scaled_size;
    p_Var5 = (_func_void_j_decompress_ptr_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION *)
             (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components << 4);
    pjVar3[6].process_data = p_Var5;
    iVar1 = cinfo->num_components;
    pjVar3[7].start_pass = (_func_void_j_decompress_ptr_J_BUF_MODE *)(p_Var5 + (long)iVar1 * 8);
    if (0 < (long)iVar1) {
      piVar11 = &cinfo->comp_info->DCT_scaled_size;
      lVar9 = 0;
      do {
        lVar10 = (long)((*piVar11 * piVar11[-6]) / cinfo->min_DCT_scaled_size);
        lVar12 = lVar10 * ((long)iVar8 + 4);
        pvVar6 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,lVar12 * 0x10);
        pvVar6 = (void *)((long)pvVar6 + lVar10 * 8);
        *(void **)(pjVar3[6].process_data + lVar9 * 8) = pvVar6;
        *(void **)(pjVar3[7].start_pass + lVar9 * 8) =
             (void *)((long)pvVar6 + (long)(int)lVar12 * 8);
        lVar9 = lVar9 + 1;
        piVar11 = piVar11 + 0x18;
      } while (lVar9 < cinfo->num_components);
    }
    iVar8 = cinfo->min_DCT_scaled_size + 2;
  }
  if (0 < cinfo->num_components) {
    piVar11 = &cinfo->comp_info->DCT_scaled_size;
    lVar9 = 0;
    do {
      ppJVar7 = (*cinfo->mem->alloc_sarray)
                          ((j_common_ptr)cinfo,1,*piVar11 * piVar11[-2],
                           ((piVar11[-6] * *piVar11) / cinfo->min_DCT_scaled_size) * iVar8);
      (&pjVar4[1].start_pass)[lVar9] = (_func_void_j_decompress_ptr_J_BUF_MODE *)ppJVar7;
      lVar9 = lVar9 + 1;
      piVar11 = piVar11 + 0x18;
    } while (lVar9 < cinfo->num_components);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_d_main_controller(j_decompress_ptr cinfo, boolean need_full_buffer)
{
  my_main_ptr main_ptr;
  int ci, rgroup, ngroups;
  jpeg_component_info *compptr;

  main_ptr = (my_main_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_main_controller));
  cinfo->main = (struct jpeg_d_main_controller *)main_ptr;
  main_ptr->pub.start_pass = start_pass_main;

  if (need_full_buffer)         /* shouldn't happen */
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);

  /* Allocate the workspace.
   * ngroups is the number of row groups we need.
   */
  if (cinfo->upsample->need_context_rows) {
    if (cinfo->_min_DCT_scaled_size < 2) /* unsupported, see comments above */
      ERREXIT(cinfo, JERR_NOTIMPL);
    alloc_funny_pointers(cinfo); /* Alloc space for xbuffer[] lists */
    ngroups = cinfo->_min_DCT_scaled_size + 2;
  } else {
    ngroups = cinfo->_min_DCT_scaled_size;
  }

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    rgroup = (compptr->v_samp_factor * compptr->_DCT_scaled_size) /
      cinfo->_min_DCT_scaled_size; /* height of a row group of component */
    main_ptr->buffer[ci] = (*cinfo->mem->alloc_sarray)
                        ((j_common_ptr)cinfo, JPOOL_IMAGE,
                         compptr->width_in_blocks * compptr->_DCT_scaled_size,
                         (JDIMENSION)(rgroup * ngroups));
  }
}